

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_ids_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::CompactIdsPass::Process(CompactIdsPass *this)

{
  IRContext *pIVar1;
  Module *pMVar2;
  FeatureManager *__ptr;
  uint32_t uVar3;
  Status SVar4;
  bool modified;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  result_id_mapping;
  byte local_71;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_70;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_71 = 0;
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  IRContext::InvalidateAnalyses((this->super_Pass).context_,kAnalysisDebugInfo);
  local_38._M_unused._M_object = &local_70;
  local_20 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/compact_ids_pass.cpp:53:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/compact_ids_pass.cpp:53:7)>
             ::_M_manager;
  local_38._8_8_ = &local_71;
  Module::ForEachInst((((this->super_Pass).context_)->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                      (function<void_(spvtools::opt::Instruction_*)> *)&local_38,true);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  pIVar1 = (this->super_Pass).context_;
  pMVar2 = (pIVar1->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  if (local_70._M_element_count + 1 != (ulong)(pMVar2->header_).bound) {
    local_71 = 1;
    uVar3 = (int)local_70._M_element_count + 1;
    if (uVar3 == 0) {
      __assert_fail("bound != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/module.h"
                    ,0x3c,"void spvtools::opt::Module::SetIdBound(uint32_t)");
    }
    (pMVar2->header_).bound = uVar3;
    __ptr = (pIVar1->feature_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
            .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    (pIVar1->feature_mgr_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
    .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
         (FeatureManager *)0x0;
    if (__ptr != (FeatureManager *)0x0) {
      std::default_delete<spvtools::opt::FeatureManager>::operator()
                ((default_delete<spvtools::opt::FeatureManager> *)&pIVar1->feature_mgr_,__ptr);
    }
  }
  SVar4 = (Status)local_71;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_70);
  return SVar4 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status CompactIdsPass::Process() {
  bool modified = false;
  std::unordered_map<uint32_t, uint32_t> result_id_mapping;

  // Disable automatic DebugInfo analysis for the life of the CompactIds pass.
  // The DebugInfo manager requires the SPIR-V to be valid to run, but this is
  // not true at all times in CompactIds as it remaps all ids.
  context()->InvalidateAnalyses(IRContext::kAnalysisDebugInfo);

  context()->module()->ForEachInst(
      [&result_id_mapping, &modified](Instruction* inst) {
        auto operand = inst->begin();
        while (operand != inst->end()) {
          const auto type = operand->type;
          if (spvIsIdType(type)) {
            assert(operand->words.size() == 1);
            uint32_t& id = operand->words[0];
            uint32_t new_id = GetRemappedId(&result_id_mapping, id);
            if (id != new_id) {
              modified = true;
              id = new_id;
              // Update data cached in the instruction object.
              if (type == SPV_OPERAND_TYPE_RESULT_ID) {
                inst->SetResultId(id);
              } else if (type == SPV_OPERAND_TYPE_TYPE_ID) {
                inst->SetResultType(id);
              }
            }
          }
          ++operand;
        }

        uint32_t scope_id = inst->GetDebugScope().GetLexicalScope();
        if (scope_id != kNoDebugScope) {
          uint32_t new_id = GetRemappedId(&result_id_mapping, scope_id);
          if (scope_id != new_id) {
            inst->UpdateLexicalScope(new_id);
            modified = true;
          }
        }
        uint32_t inlinedat_id = inst->GetDebugInlinedAt();
        if (inlinedat_id != kNoInlinedAt) {
          uint32_t new_id = GetRemappedId(&result_id_mapping, inlinedat_id);
          if (inlinedat_id != new_id) {
            inst->UpdateDebugInlinedAt(new_id);
            modified = true;
          }
        }
      },
      true);

  if (context()->module()->id_bound() != result_id_mapping.size() + 1) {
    modified = true;
    context()->module()->SetIdBound(
        static_cast<uint32_t>(result_id_mapping.size() + 1));
    // There are ids in the feature manager that could now be invalid
    context()->ResetFeatureManager();
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}